

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

SRC_STATE * sinc_copy(SRC_STATE *state)

{
  void *__src;
  void *__dest;
  void *pvVar1;
  SINC_FILTER *to_filter;
  SINC_FILTER *from_filter;
  SRC_STATE *to;
  SRC_STATE *state_local;
  
  if (state != (SRC_STATE *)0x0) {
    if (state->private_data == (void *)0x0) {
      state_local = (SRC_STATE *)0x0;
    }
    else {
      state_local = (SRC_STATE *)calloc(1,0x50);
      if (state_local == (SRC_STATE *)0x0) {
        state_local = (SRC_STATE *)0x0;
      }
      else {
        memcpy(state_local,state,0x50);
        __src = state->private_data;
        __dest = calloc(1,0x860);
        if (__dest == (void *)0x0) {
          free(state_local);
          state_local = (SRC_STATE *)0x0;
        }
        else {
          memcpy(__dest,__src,0x860);
          pvVar1 = malloc((long)(*(int *)((long)__src + 0x54) + state->channels) << 2);
          *(void **)((long)__dest + 0x858) = pvVar1;
          if (*(long *)((long)__dest + 0x858) == 0) {
            free(state_local);
            free(__dest);
            state_local = (SRC_STATE *)0x0;
          }
          else {
            memcpy(*(void **)((long)__dest + 0x858),*(void **)((long)__src + 0x858),
                   (long)(*(int *)((long)__src + 0x54) + state->channels) << 2);
            state_local->private_data = __dest;
          }
        }
      }
    }
    return state_local;
  }
  __assert_fail("state != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                ,0x14d,"SRC_STATE *sinc_copy(SRC_STATE *)");
}

Assistant:

static SRC_STATE *
sinc_copy (SRC_STATE *state)
{
	assert (state != NULL) ;

	if (state->private_data == NULL)
		return NULL ;

	SRC_STATE *to = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!to)
		return NULL ;
	memcpy (to, state, sizeof (SRC_STATE)) ;


	SINC_FILTER* from_filter = (SINC_FILTER*) state->private_data ;
	SINC_FILTER *to_filter = (SINC_FILTER *) calloc (1, sizeof (SINC_FILTER)) ;
	if (!to_filter)
	{
		free (to) ;
		return NULL ;
	}
	memcpy (to_filter, from_filter, sizeof (SINC_FILTER)) ;
	to_filter->buffer = (float *) malloc (sizeof (float) * (from_filter->b_len + state->channels)) ;
	if (!to_filter->buffer)
	{
		free (to) ;
		free (to_filter) ;
		return NULL ;
	}
	memcpy (to_filter->buffer, from_filter->buffer, sizeof (float) * (from_filter->b_len + state->channels)) ;

	to->private_data = to_filter ;

	return to ;
}